

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O1

TestOutput * __thiscall
CommandLineTestRunner::createCompositeOutput
          (CommandLineTestRunner *this,TestOutput *outputOne,TestOutput *outputTwo)

{
  CompositeTestOutput *this_00;
  
  this_00 = (CompositeTestOutput *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/CommandLineTestRunner.cpp"
                         ,0xa8);
  CompositeTestOutput::CompositeTestOutput(this_00);
  (*(this_00->super_TestOutput)._vptr_TestOutput[0x17])(this_00,outputOne);
  (*(this_00->super_TestOutput)._vptr_TestOutput[0x18])(this_00,outputTwo);
  return &this_00->super_TestOutput;
}

Assistant:

TestOutput* CommandLineTestRunner::createCompositeOutput(TestOutput* outputOne, TestOutput* outputTwo)
{
  CompositeTestOutput* composite = new CompositeTestOutput;
  composite->setOutputOne(outputOne);
  composite->setOutputTwo(outputTwo);
  return composite;
}